

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O0

array_n<float,_1,_std::allocator<float>_> * __thiscall
sisl::array_n<float,_1,_std::allocator<float>_>::operator=
          (array_n<float,_1,_std::allocator<float>_> *this,
          array_n<float,_1,_std::allocator<float>_> *obj)

{
  int local_3c;
  undefined1 local_38 [4];
  int i;
  array_n<float,_1,_std::allocator<float>_> copy;
  array_n<float,_1,_std::allocator<float>_> *obj_local;
  array_n<float,_1,_std::allocator<float>_> *this_local;
  
  copy.last = (pointer)obj;
  array_n((array_n<float,_1,_std::allocator<float>_> *)local_38,obj);
  for (local_3c = 0; local_3c < 1; local_3c = local_3c + 1) {
    std::swap<unsigned_int>(this->_dims + local_3c,copy._dims + (long)local_3c + -2);
  }
  std::swap<float*>(&this->first,(float **)copy._dims);
  std::swap<float*>(&this->last,&copy.first);
  std::swap<float*>(&this->_array,(float **)local_38);
  ~array_n((array_n<float,_1,_std::allocator<float>_> *)local_38);
  return this;
}

Assistant:

array_n &operator=(const array_n &obj){
            array_n copy(obj);

            for(int i = 0; i < N; i++) {
                std::swap(_dims[i], copy._dims[i]);
            }
            std::swap(first, copy.first);
            std::swap(last, copy.last);
            std::swap(_array, copy._array);

            return *this;
        }